

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

peer_info * __thiscall
nuraft::raft_server::get_peer_info(peer_info *__return_storage_ptr__,raft_server *this,int32 srv_id)

{
  const_iterator cVar1;
  uint64_t uVar2;
  ptr<peer> pp;
  unique_lock<std::recursive_mutex> guard;
  int32 local_34;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_30;
  unique_lock<std::recursive_mutex> local_20;
  
  if (((this->leader_).super___atomic_base<int>._M_i == this->id_) && ((this->role_)._M_i == leader)
     ) {
    local_34 = srv_id;
    std::unique_lock<std::recursive_mutex>::unique_lock(&local_20,&this->lock_);
    cVar1 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->peers_)._M_h,&local_34);
    if (cVar1.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      __return_storage_ptr__->id_ = -1;
      __return_storage_ptr__->last_log_idx_ = 0;
      __return_storage_ptr__->last_succ_resp_us_ = 0;
    }
    else {
      __return_storage_ptr__->last_log_idx_ = 0;
      __return_storage_ptr__->last_succ_resp_us_ = 0;
      std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_30,
                 (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)cVar1.
                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                        ._M_cur + 0x10));
      __return_storage_ptr__->id_ =
           (((local_30._M_ptr)->config_).
            super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_;
      __return_storage_ptr__->last_log_idx_ =
           ((local_30._M_ptr)->last_accepted_log_idx_).super___atomic_base<unsigned_long>._M_i;
      uVar2 = timer_helper::get_us(&(local_30._M_ptr)->last_resp_timer_);
      __return_storage_ptr__->last_succ_resp_us_ = uVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_20);
  }
  else {
    __return_storage_ptr__->id_ = -1;
    __return_storage_ptr__->last_log_idx_ = 0;
    __return_storage_ptr__->last_succ_resp_us_ = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

raft_server::peer_info raft_server::get_peer_info(int32 srv_id) const {
    if (!is_leader()) return peer_info();

    recur_lock(lock_);
    auto entry = peers_.find(srv_id);
    if (entry == peers_.end()) return peer_info();

    peer_info ret;
    ptr<peer> pp = entry->second;
    ret.id_ = pp->get_id();
    ret.last_log_idx_ = pp->get_last_accepted_log_idx();
    ret.last_succ_resp_us_ = pp->get_resp_timer_us();
    return ret;
}